

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Link.cpp
# Opt level: O2

TShHandleBase * ConstructLinker(EShExecutable executable,int param_2)

{
  TGenericLinker *this;
  
  this = (TGenericLinker *)operator_new(0xa8);
  TGenericLinker::TGenericLinker(this,executable);
  return (TShHandleBase *)this;
}

Assistant:

TShHandleBase* ConstructLinker(EShExecutable executable, int) { return new TGenericLinker(executable); }